

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void print_rel(wchar_t c,uint8_t a,wchar_t y,wchar_t x)

{
  int iVar1;
  int iVar2;
  wchar_t x_00;
  wchar_t y_00;
  wchar_t vx;
  wchar_t vy;
  wchar_t kx;
  wchar_t ky;
  wchar_t x_local;
  wchar_t y_local;
  uint8_t a_local;
  wchar_t c_local;
  
  print_rel_map(c,a,y,x);
  iVar1 = y - Term->offset_y;
  if ((((-1 < iVar1) &&
       (iVar1 < ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode])
                / (int)(uint)tile_height)) && (iVar2 = x - Term->offset_x, -1 < iVar2)) &&
     (iVar2 < ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width)) {
    x_00 = col_map[Term->sidebar_mode] + (uint)tile_width * iVar2;
    y_00 = row_top_map[Term->sidebar_mode] + (uint)tile_height * iVar1;
    Term_queue_char(Term,x_00,y_00,(uint)a,c,L'\0',L'\0');
    if ((1 < tile_width) || (1 < tile_height)) {
      Term_big_queue_char(Term,x_00,y_00,
                          row_top_map[Term->sidebar_mode] +
                          ((Term->hgt - row_top_map[Term->sidebar_mode]) -
                          row_bottom_map[Term->sidebar_mode]),(uint)a,c,L'\0',L'\0');
    }
  }
  return;
}

Assistant:

void print_rel(wchar_t c, uint8_t a, int y, int x)
{
	int ky, kx;
	int vy, vx;

	/* Print on map sub-windows */
	print_rel_map(c, a, y, x);

	/* Location relative to panel */
	ky = y - Term->offset_y;

	/* Verify location */
	if ((ky < 0) || (ky >= SCREEN_HGT)) return;

	/* Location relative to panel */
	kx = x - Term->offset_x;

	/* Verify location */
	if ((kx < 0) || (kx >= SCREEN_WID)) return;

	/* Get right position */
	vx = COL_MAP + (tile_width * kx);
	vy = ROW_MAP + (tile_height * ky);

	/* Hack -- Queue it */
	Term_queue_char(Term, vx, vy, a, c, 0, 0);

	if ((tile_width > 1) || (tile_height > 1))
		Term_big_queue_char(Term, vx, vy, ROW_MAP + SCREEN_ROWS,
			a, c, 0, 0);
  
}